

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void SignedShift8b_SSE2(__m128i *x)

{
  longlong lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i alVar4;
  __m128i hi_1;
  __m128i lo_1;
  __m128i hi_0;
  __m128i lo_0;
  __m128i zero;
  __m128i *x_local;
  
  lVar1 = (*x)[0];
  lo_1[1]._0_1_ = (byte)lVar1;
  lo_1[1]._1_1_ = (undefined1)((ulong)lVar1 >> 8);
  lo_1[1]._2_1_ = (undefined1)((ulong)lVar1 >> 0x10);
  lo_1[1]._3_1_ = (undefined1)((ulong)lVar1 >> 0x18);
  lo_1[1]._4_1_ = (byte)((ulong)lVar1 >> 0x20);
  lo_1[1]._5_1_ = (undefined1)((ulong)lVar1 >> 0x28);
  lo_1[1]._6_1_ = (undefined1)((ulong)lVar1 >> 0x30);
  lo_1[1]._7_1_ = (undefined1)((ulong)lVar1 >> 0x38);
  lVar1 = (*x)[1];
  zero[0]._0_1_ = (byte)lVar1;
  zero[0]._1_1_ = (undefined1)((ulong)lVar1 >> 8);
  zero[0]._2_1_ = (undefined1)((ulong)lVar1 >> 0x10);
  zero[0]._3_1_ = (undefined1)((ulong)lVar1 >> 0x18);
  zero[0]._4_1_ = (byte)((ulong)lVar1 >> 0x20);
  zero[0]._5_1_ = (undefined1)((ulong)lVar1 >> 0x28);
  zero[0]._6_1_ = (undefined1)((ulong)lVar1 >> 0x30);
  zero[0]._7_1_ = (undefined1)((ulong)lVar1 >> 0x38);
  auVar2[3] = lo_1[1]._1_1_;
  auVar2._0_3_ = (uint3)(byte)lo_1[1] << 8;
  auVar2[4] = 0;
  auVar2[5] = lo_1[1]._2_1_;
  auVar2[6] = 0;
  auVar2[7] = lo_1[1]._3_1_;
  auVar2[0xb] = lo_1[1]._5_1_;
  auVar2._8_3_ = (uint3)lo_1[1]._4_1_ << 8;
  auVar2[0xc] = 0;
  auVar2[0xd] = lo_1[1]._6_1_;
  auVar2[0xe] = 0;
  auVar2[0xf] = lo_1[1]._7_1_;
  auVar2 = psraw(auVar2,ZEXT416(0xb));
  auVar3[3] = zero[0]._1_1_;
  auVar3._0_3_ = (uint3)(byte)zero[0] << 8;
  auVar3[4] = 0;
  auVar3[5] = zero[0]._2_1_;
  auVar3[6] = 0;
  auVar3[7] = zero[0]._3_1_;
  auVar3[0xb] = zero[0]._5_1_;
  auVar3._8_3_ = (uint3)zero[0]._4_1_ << 8;
  auVar3[0xc] = 0;
  auVar3[0xd] = zero[0]._6_1_;
  auVar3[0xe] = 0;
  auVar3[0xf] = zero[0]._7_1_;
  auVar3 = psraw(auVar3,ZEXT416(0xb));
  alVar4 = (__m128i)packsswb(auVar2,auVar3);
  *x = alVar4;
  return;
}

Assistant:

static WEBP_INLINE void SignedShift8b_SSE2(__m128i* const x) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i lo_0 = _mm_unpacklo_epi8(zero, *x);
  const __m128i hi_0 = _mm_unpackhi_epi8(zero, *x);
  const __m128i lo_1 = _mm_srai_epi16(lo_0, 3 + 8);
  const __m128i hi_1 = _mm_srai_epi16(hi_0, 3 + 8);
  *x = _mm_packs_epi16(lo_1, hi_1);
}